

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

Action<BasicTestExpr<2>_(bool)> * __thiscall
testing::internal::OnCallSpec<BasicTestExpr<2>_(bool)>::GetAction
          (OnCallSpec<BasicTestExpr<2>_(bool)> *this)

{
  long in_RDI;
  undefined1 uVar1;
  undefined7 in_stack_ffffffffffffffb0;
  allocator<char> local_29;
  string local_28 [8];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  uVar1 = *(int *)(in_RDI + 0xc) == 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  UntypedOnCallSpecBase::AssertSpecProperty
            ((UntypedOnCallSpecBase *)CONCAT17(uVar1,in_stack_ffffffffffffffb0),
             SUB81((ulong)in_RDI >> 0x38,0),(string *)0x1e107e);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  return (Action<BasicTestExpr<2>_(bool)> *)(in_RDI + 0x40);
}

Assistant:

const Action<F>& GetAction() const {
    AssertSpecProperty(last_clause_ == kWillByDefault,
                       ".WillByDefault() must appear exactly "
                       "once in an ON_CALL().");
    return action_;
  }